

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O0

void yin_write(yin_t *pe,int16 *frame)

{
  int iVar1;
  uint ndiff;
  int iVar2;
  int difflen;
  int outptr;
  int16 *frame_local;
  yin_t *pe_local;
  
  pe->wstart = pe->wstart + '\x01';
  iVar1 = pe->wstart - 1;
  if (pe->wstart == pe->wsize) {
    pe->wstart = '\0';
  }
  ndiff = pe->frame_size / 2;
  cmn_diff(frame,pe->diff_window[iVar1],ndiff);
  iVar2 = thresholded_search(pe->diff_window[iVar1],(uint)pe->search_threshold,0,ndiff);
  pe->period_window[iVar1] = (uint16)iVar2;
  pe->nfr = pe->nfr + 1;
  return;
}

Assistant:

void
yin_write(yin_t *pe, int16 const *frame)
{
    int outptr, difflen;

    /* Rotate the window one frame forward. */
    ++pe->wstart;
    /* Fill in the frame before wstart. */
    outptr = pe->wstart - 1;
    /* Wrap around the window pointer. */
    if (pe->wstart == pe->wsize)
        pe->wstart = 0;

    /* Now calculate normalized difference function. */
    difflen = pe->frame_size / 2;
    cmn_diff(frame, pe->diff_window[outptr], difflen);

    /* Find the first point under threshold.  If not found, then
     * use the absolute minimum. */
    pe->period_window[outptr]
        = thresholded_search(pe->diff_window[outptr],
                             pe->search_threshold, 0, difflen);

    /* Increment total number of frames. */
    ++pe->nfr;
}